

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

void __thiscall
helics::ValueFederate::ValueFederate(ValueFederate *this,void **vtt,string *configString)

{
  char *in_RCX;
  string *in_R8;
  string_view fedName;
  undefined1 *local_28;
  undefined8 local_20;
  undefined1 local_18 [16];
  
  local_28 = local_18;
  local_20 = 0;
  local_18[0] = 0;
  fedName._M_str = in_RCX;
  fedName._M_len = (size_t)configString;
  ValueFederate(this,vtt,fedName,in_R8);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

ValueFederate::ValueFederate(const std::string& configString):
    ValueFederate(std::string{}, configString)
{
}